

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::LargeHeapBucket::SnailAlloc
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,bool nothrow)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined6 in_register_00000082;
  undefined8 *in_FS_OFFSET;
  
  if (0x3ff < (uint)CONCAT62(in_register_00000082,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x40,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) goto LAB_0024d816;
    *puVar1 = 0;
  }
  if (recycler->disableCollectOnAllocationHeuristics == true) {
    iVar4 = Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(recycler);
  }
  else {
    iVar4 = Recycler::CollectNow<(Memory::CollectionFlags)404819971>(recycler);
  }
  if (iVar4 == 0) {
    pcVar5 = TryAllocFromNewHeapBlock(this,recycler,sizeCat,size,attributes,nothrow);
    if (pcVar5 != (char *)0x0) {
      return pcVar5;
    }
    if ((recycler->recyclerFlagsTable->Verbose == true) &&
       (bVar3 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase),
       bVar3)) {
      Output::Print(L"LargeHeapBucket::AddLargeHeapBlock failed, forcing in-thread collection\n");
    }
    Recycler::CollectNow<(Memory::CollectionFlags)16384>(recycler);
  }
  if (InternalObjectInfoBitMask < attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.inl"
                       ,10,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) {
LAB_0024d816:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if ((this->largeBlockList != (LargeHeapBlock *)0x0) &&
     (pcVar5 = LargeHeapBlock::Alloc(this->largeBlockList,sizeCat,attributes), pcVar5 != (char *)0x0
     )) {
    return pcVar5;
  }
  if (this->supportFreeList == true) {
    pcVar5 = TryAllocFromExplicitFreeList(this,recycler,sizeCat,attributes);
    if (pcVar5 != (char *)0x0) {
      return pcVar5;
    }
    pcVar5 = TryAllocFromFreeList(this,recycler,sizeCat,attributes);
    if (pcVar5 != (char *)0x0) {
      return pcVar5;
    }
  }
  pcVar5 = TryAllocFromNewHeapBlock(this,recycler,sizeCat,size,attributes,nothrow);
  if (pcVar5 == (char *)0x0 && !nothrow) {
    Recycler::OutOfMemory(recycler);
    pcVar5 = (char *)0x0;
  }
  return pcVar5;
}

Assistant:

char *
LargeHeapBucket::SnailAlloc(Recycler * recycler, size_t sizeCat, size_t size, ObjectInfoBits attributes, bool nothrow)
{
    char * memBlock;

    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    // No free memory, try to collect with allocated bytes and time heuristic, and concurrently
#if ENABLE_CONCURRENT_GC
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? recycler->FinishConcurrent<FinishConcurrentOnAllocation>() :
        recycler->CollectNow<CollectOnAllocation>();
#else
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? FALSE : recycler->CollectNow<CollectOnAllocation>();
#endif

    if (!collected)
    {
        memBlock = TryAllocFromNewHeapBlock(recycler, sizeCat, size, attributes, nothrow);
        if (memBlock != nullptr)
        {
            return memBlock;
        }
        // Can't even allocate a new block, we need force a collection and
        // allocate some free memory, add a new heap block again, or throw out of memory
        AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("LargeHeapBucket::AddLargeHeapBlock failed, forcing in-thread collection\n"));
        recycler->CollectNow<CollectNowForceInThread>();
    }

    memBlock = TryAlloc(recycler, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    memBlock = TryAllocFromNewHeapBlock(recycler, sizeCat, size, attributes, nothrow);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    if (nothrow == false)
    {
        // Can't add a heap block, we are out of memory
        // Since nothrow is false, we can throw right here
        recycler->OutOfMemory();
    }

    return nullptr;
}